

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O2

void __thiscall ReconnectingHub::connectionCreated(ReconnectingHub *this,Stream *stream)

{
  ostream *poVar1;
  string sStack_38;
  
  this->connected = true;
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"Connected to ");
  Dashel::Stream::getTargetName_abi_cxx11_(&sStack_38,stream);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

virtual void connectionCreated(Stream* stream)
	{
		connected = true;
		cout << endl
			 << "Connected to " << stream->getTargetName() << endl;
	}